

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_without_glx.c
# Opt level: O0

EGLBoolean override_eglBindAPI(EGLenum api)

{
  undefined8 uVar1;
  code *pcVar2;
  _func_EGLBoolean_EGLenum *real_eglBindAPI;
  void *egl;
  EGLenum api_local;
  
  uVar1 = dlopen("libEGL.so.1",1);
  pcVar2 = (code *)dlsym(uVar1,"eglBindAPI");
  last_api = api;
  if (api == 0x30a2) {
    extra_error = 0x300c;
    egl._4_4_ = 0;
  }
  else {
    if (pcVar2 == (code *)0x0) {
      __assert_fail("real_eglBindAPI",
                    "/workspace/llm4binary/github/license_c_cmakelists/yaronct[P]libepoxy/test/egl_without_glx.c"
                    ,0x42,"EGLBoolean override_eglBindAPI(EGLenum)");
    }
    egl._4_4_ = (*pcVar2)(api);
  }
  return egl._4_4_;
}

Assistant:

static EGLBoolean
override_eglBindAPI(EGLenum api)
{
    void *egl = dlopen("libEGL.so.1", RTLD_LAZY | RTLD_LOCAL);
    EGLBoolean (*real_eglBindAPI)(EGLenum api) = dlsym(egl, "eglBindAPI");

    last_api = api;

    if (api == EGL_OPENGL_API) {
        extra_error = EGL_BAD_PARAMETER;
        return EGL_FALSE;
    }

    assert(real_eglBindAPI);
    return real_eglBindAPI(api);
}